

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

size_t __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::getrank
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_const_ref t,size_t index,
          size_t prevrank)

{
  bool bVar1;
  size_t *psVar2;
  size_t in_RDX;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_RSI;
  size_t in_RDI;
  subtree_const_ref in_stack_00000000;
  size_t in_stack_00000028;
  subtree_ref_base<true> *in_stack_00000030;
  size_t pr;
  size_t new_index;
  size_t child;
  unsigned_long *in_stack_ffffffffffffff20;
  pair<unsigned_long,_unsigned_long> *in_stack_ffffffffffffff28;
  subtree_ref_base<true> *in_stack_ffffffffffffff30;
  subtree_ref_base<true> *this_00;
  size_t in_stack_ffffffffffffffa8;
  subtree_ref_base<true> *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffd8;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *this_01;
  size_t local_8;
  
  this_00 = (subtree_ref_base<true> *)&stack0x00000008;
  this_01 = in_RSI;
  psVar2 = subtree_ref_base<true>::size(this_00);
  if (in_RSI == (bt_impl<4096UL,_(bv::allocation_policy_t)0> *)*psVar2) {
    psVar2 = subtree_ref_base<true>::rank(this_00);
    local_8 = *psVar2 + in_RDX;
  }
  else {
    local_8 = in_RDX;
    if (this_01 != (bt_impl<4096UL,_(bv::allocation_policy_t)0> *)0x0) {
      bVar1 = subtree_ref_base<true>::is_leaf(this_00);
      if (bVar1) {
        subtree_ref_base<true>::leaf((subtree_ref_base<true> *)0x162467);
        local_8 = bitview<bv::internal::bitarray_t<4096UL>::array>::popcount
                            ((bitview<bv::internal::bitarray_t<4096UL>::array> *)in_RSI,in_RDI,
                             (size_t)this_00);
        local_8 = local_8 + in_RDX;
      }
      else {
        subtree_ref_base<true>::find_insert_point
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        std::tie<unsigned_long,unsigned_long>
                  (&in_stack_ffffffffffffff28->first,in_stack_ffffffffffffff20);
        std::tuple<unsigned_long&,unsigned_long&>::operator=
                  ((tuple<unsigned_long_&,_unsigned_long_&> *)in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff28);
        if (in_stack_ffffffffffffffd8 != 0) {
          subtree_ref_base<true>::ranks(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28)
          ;
          const_item_reference::operator_cast_to_unsigned_long
                    ((const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                      *)0x16253e);
        }
        subtree_ref_base<true>::child(in_stack_00000030,in_stack_00000028);
        local_8 = getrank(this_01,in_stack_00000000,in_RDX,in_stack_ffffffffffffffd8);
      }
    }
  }
  return local_8;
}

Assistant:

size_t bt_impl<W, AP>::getrank(subtree_const_ref t,
                                       size_t index, size_t prevrank) const
        {
            assert(index <= t.size() && "Index out of bounds");
            
            // Short circuit for special cases
            if(index == t.size())
                return t.rank() + prevrank;
            
            if(index == 0)
                return prevrank;
            
            if(t.is_leaf())
                return t.leaf().popcount(0, index) + prevrank;
            else {
                size_t child, new_index;
                tie(child, new_index) = t.find_insert_point(index);
                
                size_t pr = child == 0 ? prevrank
                                       : prevrank + t.ranks(child - 1);
                
                return getrank(t.child(child), new_index, pr);
            }
        }